

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O0

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::
OneofOnlySetLast<proto2_unittest::TestAllTypes>::TestBody
          (OneofOnlySetLast<proto2_unittest::TestAllTypes> *this)

{
  bool bVar1;
  int size;
  uint32_t *puVar2;
  Arena *arena;
  size_t sVar3;
  char *pcVar4;
  void *data_00;
  char *in_R9;
  string local_260;
  AssertHelper local_240;
  Message local_238;
  bool local_229;
  undefined1 local_228 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_1f8;
  Message local_1f0;
  bool local_1e1;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar__1;
  CodedInputStream input;
  ArrayInputStream raw_input;
  string local_158;
  AssertHelper local_138;
  Message local_130;
  bool local_121;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_;
  CodedOutputStream output;
  StringOutputStream raw_output;
  string data;
  undefined1 local_80 [8];
  TestOneof oneof_dest;
  TestOneofBackwardsCompatible source;
  OneofOnlySetLast<proto2_unittest::TestAllTypes> *this_local;
  
  source.field_0._32_8_ = this;
  proto2_unittest::TestOneofBackwardsCompatible::TestOneofBackwardsCompatible
            ((TestOneofBackwardsCompatible *)&oneof_dest.field_0._impl_._cached_size_);
  proto2_unittest::TestOneof::TestOneof((TestOneof *)local_80);
  std::__cxx11::string::string((string *)&raw_output.target_);
  proto2_unittest::TestOneofBackwardsCompatible::set_foo_int
            ((TestOneofBackwardsCompatible *)&oneof_dest.field_0._impl_._cached_size_,100);
  puVar2 = HasBits<1>::operator[]
                     ((HasBits<1> *)&source.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  arena = protobuf::MessageLite::GetArena((MessageLite *)&oneof_dest.field_0._impl_._cached_size_);
  ArenaStringPtr::Set((ArenaStringPtr *)&source.field_0._impl_,"101",arena);
  protobuf::io::StringOutputStream::StringOutputStream
            ((StringOutputStream *)&output.start_count_,(string *)&raw_output.target_);
  protobuf::io::CodedOutputStream::CodedOutputStream<google::protobuf::io::StringOutputStream,void>
            ((CodedOutputStream *)&gtest_ar_.message_,(StringOutputStream *)&output.start_count_);
  sVar3 = proto2_unittest::TestOneofBackwardsCompatible::ByteSizeLong
                    ((TestOneofBackwardsCompatible *)&oneof_dest.field_0._impl_._cached_size_);
  WireFormat::SerializeWithCachedSizes
            ((Message *)&oneof_dest.field_0._impl_._cached_size_,(int)sVar3,
             (CodedOutputStream *)&gtest_ar_.message_);
  bVar1 = protobuf::io::CodedOutputStream::HadError((CodedOutputStream *)&gtest_ar_.message_);
  local_121 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_120,&local_121,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_158,(internal *)local_120,(AssertionResult *)0x1e94969,"true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x128,pcVar4);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  protobuf::io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&gtest_ar_.message_);
  protobuf::io::StringOutputStream::~StringOutputStream((StringOutputStream *)&output.start_count_);
  if (bVar1) {
    data_00 = (void *)std::__cxx11::string::data();
    size = std::__cxx11::string::size();
    protobuf::io::ArrayInputStream::ArrayInputStream
              ((ArrayInputStream *)&input.extension_factory_,data_00,size,-1);
    protobuf::io::CodedInputStream::CodedInputStream
              ((CodedInputStream *)&gtest_ar__1.message_,
               (ZeroCopyInputStream *)&input.extension_factory_);
    WireFormat::ParseAndMergePartial((CodedInputStream *)&gtest_ar__1.message_,(Message *)local_80);
    bVar1 = proto2_unittest::TestOneof::has_foo_int((TestOneof *)local_80);
    local_1e1 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1e0,&local_1e1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
    if (!bVar1) {
      testing::Message::Message(&local_1f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_1e0,
                 (AssertionResult *)"oneof_dest.has_foo_int()","true","false",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x12f,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_1f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
    local_229 = proto2_unittest::TestOneof::has_foo_string((TestOneof *)local_80);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_228,&local_229,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
    if (!bVar1) {
      testing::Message::Message(&local_238);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_260,(internal *)local_228,(AssertionResult *)"oneof_dest.has_foo_string()",
                 "false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_240,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x130,pcVar4);
      testing::internal::AssertHelper::operator=(&local_240,&local_238);
      testing::internal::AssertHelper::~AssertHelper(&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      testing::Message::~Message(&local_238);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
    protobuf::io::CodedInputStream::~CodedInputStream((CodedInputStream *)&gtest_ar__1.message_);
    protobuf::io::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&input.extension_factory_)
    ;
  }
  std::__cxx11::string::~string((string *)&raw_output.target_);
  proto2_unittest::TestOneof::~TestOneof((TestOneof *)local_80);
  proto2_unittest::TestOneofBackwardsCompatible::~TestOneofBackwardsCompatible
            ((TestOneofBackwardsCompatible *)&oneof_dest.field_0._impl_._cached_size_);
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, OneofOnlySetLast) {
  typename TestFixture::TestOneofBackwardsCompatible source;
  typename TestFixture::TestOneof oneof_dest;
  std::string data;

  // Set two fields
  source.set_foo_int(100);
  source.set_foo_string("101");

  // Serialize and parse to oneof message. Generated serializer may not order
  // fields in tag order. Use WireFormat::SerializeWithCachedSizes instead as
  // it sorts fields beforehand.
  {
    io::StringOutputStream raw_output(&data);
    io::CodedOutputStream output(&raw_output);
    WireFormat::SerializeWithCachedSizes(source, source.ByteSizeLong(),
                                         &output);
    ASSERT_FALSE(output.HadError());
  }
  io::ArrayInputStream raw_input(data.data(), data.size());
  io::CodedInputStream input(&raw_input);
  WireFormat::ParseAndMergePartial(&input, &oneof_dest);

  // Only the last field is set.
  EXPECT_FALSE(oneof_dest.has_foo_int());
  EXPECT_TRUE(oneof_dest.has_foo_string());
}